

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.hh
# Opt level: O0

void __thiscall OpenMesh::IO::_OMReader_::~_OMReader_(_OMReader_ *this)

{
  _OMReader_ *this_local;
  
  ~_OMReader_(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~_OMReader_() { }